

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  exception *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__NotImplementedException_0021ebc0;
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1a5bca);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

virtual ~NotImplementedException() throw() {}